

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  GLFWvidmode *pGVar6;
  float fVar7;
  double dVar8;
  undefined1 auVar9 [16];
  bool local_141;
  float local_138;
  float position;
  mat4x4 mvp;
  mat4x4 p;
  mat4x4 m;
  int height_1;
  int width_1;
  GLFWvidmode *mode;
  GLint vpos_location;
  GLint mvp_location;
  GLuint program;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLuint vertex_buffer;
  GLFWwindow *window;
  double current_time;
  double last_time;
  int local_30;
  int height;
  int width;
  int ch;
  GLFWmonitor *monitor;
  unsigned_long frame_count;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  monitor = (GLFWmonitor *)0x0;
  _width = (GLFWmonitor *)0x0;
  frame_count = (unsigned_long)argv;
  argv_local._0_4_ = argc;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  while (height = getopt((int)argv_local,(char **)frame_count,"hf"), height != -1) {
    if (height != 0x66) {
      if (height != 0x68) {
        usage();
        exit(1);
      }
      usage();
      exit(0);
    }
    _width = glfwGetPrimaryMonitor();
  }
  if (_width == (GLFWmonitor *)0x0) {
    local_30 = 0x280;
    last_time._4_4_ = 0x1e0;
  }
  else {
    pGVar6 = glfwGetVideoMode(_width);
    glfwWindowHint(0x2100f,pGVar6->refreshRate);
    glfwWindowHint(0x21001,pGVar6->redBits);
    glfwWindowHint(0x21002,pGVar6->greenBits);
    glfwWindowHint(0x21003,pGVar6->blueBits);
    local_30 = pGVar6->width;
    last_time._4_4_ = pGVar6->height;
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  _vertex_shader =
       glfwCreateWindow(local_30,last_time._4_4_,"Tearing detector",_width,(GLFWwindow *)0x0);
  if (_vertex_shader != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(_vertex_shader);
    gladLoadGLLoader(glfwGetProcAddress);
    set_swap_interval(_vertex_shader,0);
    current_time = glfwGetTime();
    frame_rate = 0.0;
    iVar1 = glfwExtensionSupported("WGL_EXT_swap_control_tear");
    local_141 = true;
    if (iVar1 == 0) {
      iVar1 = glfwExtensionSupported("GLX_EXT_swap_control_tear");
      local_141 = iVar1 != 0;
    }
    swap_tear = (int)local_141;
    glfwSetKeyCallback(_vertex_shader,key_callback);
    (*glad_glGenBuffers)(1,&fragment_shader);
    (*glad_glBindBuffer)(0x8892,fragment_shader);
    (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
    GVar2 = (*glad_glCreateShader)(0x8b31);
    (*glad_glShaderSource)(GVar2,1,&vertex_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(GVar2);
    GVar3 = (*glad_glCreateShader)(0x8b30);
    (*glad_glShaderSource)(GVar3,1,&fragment_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(GVar3);
    GVar4 = (*glad_glCreateProgram)();
    (*glad_glAttachShader)(GVar4,GVar2);
    (*glad_glAttachShader)(GVar4,GVar3);
    (*glad_glLinkProgram)(GVar4);
    GVar5 = (*glad_glGetUniformLocation)(GVar4,"MVP");
    GVar2 = (*glad_glGetAttribLocation)(GVar4,"vPos");
    (*glad_glEnableVertexAttribArray)(GVar2);
    (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',8,(void *)0x0);
    while (iVar1 = glfwWindowShouldClose(_vertex_shader), iVar1 == 0) {
      dVar8 = glfwGetTime();
      fVar7 = cosf((float)dVar8 * 4.0);
      glfwGetFramebufferSize(_vertex_shader,(int *)(m[3] + 3),(int *)(m[3] + 2));
      (*glad_glViewport)(0,0,(GLsizei)m[3][3],(GLsizei)m[3][2]);
      (*glad_glClear)(0x4000);
      mat4x4_ortho((vec4 *)(mvp[3] + 2),-1.0,1.0,-1.0,1.0,0.0,1.0);
      mat4x4_translate((vec4 *)(p[3] + 2),fVar7 * 0.75,0.0,0.0);
      mat4x4_mul((vec4 *)&local_138,(vec4 *)(mvp[3] + 2),(vec4 *)(p[3] + 2));
      (*glad_glUseProgram)(GVar4);
      (*glad_glUniformMatrix4fv)(GVar5,1,'\0',&local_138);
      (*glad_glDrawArrays)(6,0,4);
      glfwSwapBuffers(_vertex_shader);
      glfwPollEvents();
      monitor = monitor + 1;
      window = (GLFWwindow *)glfwGetTime();
      if (1.0 < (double)window - current_time) {
        auVar9._8_4_ = (int)((ulong)monitor >> 0x20);
        auVar9._0_8_ = monitor;
        auVar9._12_4_ = 0x45300000;
        frame_rate = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)monitor) - 4503599627370496.0)) /
                     ((double)window - current_time);
        monitor = (GLFWmonitor *)0x0;
        current_time = (double)window;
        update_window_title(_vertex_shader);
      }
    }
    glfwTerminate();
    exit(0);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    unsigned long frame_count = 0;
    GLFWmonitor* monitor = NULL;
    int ch, width, height;
    double last_time, current_time;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt(argc, argv, "hf")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);
        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width  = 640;
        height = 480;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(width, height, "Tearing detector", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    set_swap_interval(window, 0);

    last_time = glfwGetTime();
    frame_rate = 0.0;
    swap_tear = (glfwExtensionSupported("WGL_EXT_swap_control_tear") ||
                 glfwExtensionSupported("GLX_EXT_swap_control_tear"));

    glfwSetKeyCallback(window, key_callback);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        mat4x4 m, p, mvp;
        float position = cosf((float) glfwGetTime() * 4.f) * 0.75f;

        glfwGetFramebufferSize(window, &width, &height);

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4_ortho(p, -1.f, 1.f, -1.f, 1.f, 0.f, 1.f);
        mat4x4_translate(m, position, 0.f, 0.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
            update_window_title(window);
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}